

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O3

void __thiscall
spirv_cross::CompilerMSL::add_variable_to_interface_block
          (CompilerMSL *this,StorageClass storage,string *ib_var_ref,SPIRType *ib_type,
          SPIRVariable *var,InterfaceBlockMeta *meta)

{
  uint uVar1;
  TypeID id;
  Variant *pVVar2;
  size_t sVar3;
  SPIRFunction *pSVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  byte bVar8;
  byte bVar9;
  bool bVar10;
  BuiltIn BVar11;
  uint32_t uVar12;
  ExecutionModel EVar13;
  SPIRType *type;
  SPIRType *type_00;
  ulong uVar14;
  SPIRConstant *pSVar15;
  undefined7 extraout_var;
  runtime_error *prVar16;
  uint *ts_1;
  ulong uVar17;
  StorageClass storage_00;
  SPIRVariable *pSVar18;
  uint32_t uVar19;
  ID IVar20;
  BuiltIn builtin;
  undefined4 local_24c;
  uint local_248;
  uint32_t var_mbr_idx;
  undefined4 local_240;
  uint32_t location;
  string *local_238;
  SPIRType *local_230;
  uint32_t local_224;
  InterfaceBlockMeta *local_220;
  uint32_t initializer;
  undefined4 uStack_214;
  undefined1 local_208 [16];
  string mbr_name_qual;
  uint32_t ptr_type_id;
  undefined4 uStack_1c4;
  char local_1b8 [16];
  SPIRFunction *local_1a8;
  SPIRVariable *local_1a0;
  SmallVector<unsigned_int,_8UL> *local_198;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)2>,_8UL> *local_190;
  ParsedIR *local_188;
  SPIRType ptr_type;
  
  pSVar18 = var;
  local_238 = ib_var_ref;
  local_230 = ib_type;
  local_1a8 = Variant::get<spirv_cross::SPIRFunction>
                        ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                         super_VectorView<spirv_cross::Variant>.ptr +
                         (this->super_CompilerGLSL).super_Compiler.ir.default_entry_point.id);
  if (meta->strip_array == true) {
    type = Compiler::get_variable_element_type((Compiler *)this,var);
  }
  else {
    type = Compiler::get_variable_data_type((Compiler *)this,var);
  }
  bVar5 = Compiler::is_builtin_variable((Compiler *)this,var);
  BVar11 = Compiler::get_decoration
                     ((Compiler *)this,(ID)(var->super_IVariant).self.id,DecorationBuiltIn);
  builtin = BVar11;
  bVar6 = Compiler::has_decoration
                    ((Compiler *)this,(ID)(type->super_IVariant).self.id,DecorationBlock);
  if (storage == StorageClassOutput) {
    bVar7 = CompilerGLSL::is_stage_output_variable_masked(&this->super_CompilerGLSL,var);
    if (bVar7) {
      emit_local_masked_variable(this,var,meta->strip_array);
      return;
    }
LAB_002a07a6:
    local_24c = 0;
  }
  else {
    if (storage != StorageClassInput) goto LAB_002a07a6;
    bVar7 = Compiler::has_decoration
                      ((Compiler *)this,(ID)(var->super_IVariant).self.id,DecorationPerVertexKHR);
    local_24c = (undefined4)CONCAT71((int7)((ulong)ib_type >> 8),1);
    if (bVar7) {
      prVar16 = (runtime_error *)__cxa_allocate_exception(0x10);
      ptr_type.super_IVariant._vptr_IVariant = (_func_int **)&ptr_type.width;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&ptr_type,"PerVertexKHR decoration is not supported in MSL.","");
      ::std::runtime_error::runtime_error(prVar16,(string *)&ptr_type);
      *(undefined ***)prVar16 = &PTR__runtime_error_003d4e98;
      __cxa_throw(prVar16,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  CompilerGLSL::add_resource_name(&this->super_CompilerGLSL,(var->super_IVariant).self.id);
  local_220 = meta;
  if (*(int *)&(type->super_IVariant).field_0xc != 0xf) {
    EVar13 = Compiler::get_execution_model((Compiler *)this);
    if (((char)local_24c == '\x01' && EVar13 == ExecutionModelTessellationEvaluation) &&
       ((~meta->strip_array & bVar5 & BVar11 - BuiltInTessLevelOuter < 2) == 1)) {
      add_tess_level_input_to_interface_block(this,local_238,local_230,var);
      return;
    }
    uVar1 = *(uint *)&(type->super_IVariant).field_0xc;
    if (0x17 < uVar1) {
      return;
    }
    if ((0x8077fcU >> (uVar1 & 0x1f) & 1) == 0) {
      return;
    }
    if ((bVar5) && (bVar6 = Compiler::has_active_builtin((Compiler *)this,BVar11,storage), !bVar6))
    {
      return;
    }
    bVar6 = Compiler::is_matrix((Compiler *)this,type);
    if (bVar6) {
      bVar6 = false;
    }
    else {
      bVar6 = Compiler::is_array((Compiler *)this,type);
      bVar6 = !bVar6;
    }
    bVar7 = variable_storage_requires_stage_io(this,storage);
    bVar10 = true;
    if ((char)local_24c != '\0') {
      EVar13 = Compiler::get_execution_model((Compiler *)this);
      bVar10 = EVar13 == ExecutionModelFragment;
    }
    meta = local_220;
    if ((!bVar6 && bVar7) && (bVar5 & bVar10 & BVar11 - BuiltInVertexId < 0xfffffffe) == 0) {
      add_composite_variable_to_interface_block(this,storage,local_238,local_230,var,local_220);
      return;
    }
LAB_002a09b8:
    add_plain_variable_to_interface_block(this,storage,local_238,local_230,var,meta);
    return;
  }
  bVar7 = variable_storage_requires_stage_io(this,storage);
  if ((!bVar7) && (bVar6)) {
    bVar7 = (type->array).super_VectorView<unsigned_int>.buffer_size == 0;
  }
  bVar8 = 1;
  if ((!bVar5 && bVar7 == true) && (meta->allow_local_declaration == true)) {
    emit_local_masked_variable(this,var,meta->strip_array);
    bVar8 = 0;
  }
  if (bVar7 == false) goto LAB_002a09b8;
  location = 0xffffffff;
  var_mbr_idx = 0;
  bVar5 = Compiler::is_matrix((Compiler *)this,type);
  bVar7 = Compiler::is_array((Compiler *)this,type);
  if (bVar5) {
    if (bVar7) {
      prVar16 = (runtime_error *)__cxa_allocate_exception(0x10);
      ptr_type.super_IVariant._vptr_IVariant = (_func_int **)&ptr_type.width;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&ptr_type,
                 "MSL cannot emit arrays-of-matrices in input and output variables.","");
      ::std::runtime_error::runtime_error(prVar16,(string *)&ptr_type);
      *(undefined ***)prVar16 = &PTR__runtime_error_003d4e98;
      __cxa_throw(prVar16,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    uVar12 = type->columns;
  }
  else {
    if (!bVar7) {
      uVar12 = 1;
      goto LAB_002a0a40;
    }
    if ((type->array).super_VectorView<unsigned_int>.buffer_size != 1) {
      prVar16 = (runtime_error *)__cxa_allocate_exception(0x10);
      ptr_type.super_IVariant._vptr_IVariant = (_func_int **)&ptr_type.width;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&ptr_type,
                 "MSL cannot emit arrays-of-arrays in input and output variables.","");
      ::std::runtime_error::runtime_error(prVar16,(string *)&ptr_type);
      *(undefined ***)prVar16 = &PTR__runtime_error_003d4e98;
      __cxa_throw(prVar16,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    uVar12 = CompilerGLSL::to_array_size_literal(&this->super_CompilerGLSL,type);
  }
  if (uVar12 == 0) {
    return;
  }
LAB_002a0a40:
  local_248 = 0;
  local_188 = &(this->super_CompilerGLSL).super_Compiler.ir;
  local_190 = &local_1a8->local_variables;
  local_198 = &this->vars_needing_early_declaration;
  uVar14 = (ulong)(uint)(type->member_types).
                        super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size;
  uVar19 = 0;
  bVar9 = 0;
  local_224 = uVar12;
  local_1a0 = var;
  do {
    if ((int)uVar14 != 0) {
      uVar17 = 0;
      do {
        builtin = BuiltInMax;
        uVar12 = (uint32_t)uVar17;
        bVar5 = Compiler::is_member_builtin((Compiler *)this,type,uVar12,&builtin);
        type_00 = Variant::get<spirv_cross::SPIRType>
                            ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                             super_VectorView<spirv_cross::Variant>.ptr +
                             (type->member_types).
                             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr
                             [uVar17].id);
        if ((storage == StorageClassOutput) &&
           (bVar7 = CompilerGLSL::is_stage_output_block_member_masked
                              (&this->super_CompilerGLSL,var,uVar12,meta->strip_array), bVar7)) {
          location = 0xffffffff;
          bVar9 = bVar9 | bVar6;
          if ((bVar5) && (meta->strip_array == false)) {
            uVar12 = ParsedIR::increase_bound_by(local_188,2);
            ptr_type_id = uVar12;
            SPIRType::SPIRType(&ptr_type,type_00);
            ptr_type.pointer = true;
            ptr_type.pointer_depth = ptr_type.pointer_depth + 1;
            ptr_type.parent_type.id =
                 (type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>
                 .ptr[uVar17].id;
            ptr_type.storage = StorageClassOutput;
            initializer = 0;
            uVar14 = (ulong)(var->initializer).id;
            if ((uVar14 != 0) &&
               ((uVar14 < (this->super_CompilerGLSL).super_Compiler.ir.ids.
                          super_VectorView<spirv_cross::Variant>.buffer_size &&
                (pVVar2 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
                          super_VectorView<spirv_cross::Variant>.ptr,
                pVVar2[uVar14].type == TypeConstant)))) {
              pSVar15 = Variant::get<spirv_cross::SPIRConstant>(pVVar2 + uVar14);
              initializer = (pSVar15->subconstants).
                            super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>.ptr
                            [uVar17].id;
            }
            Compiler::set<spirv_cross::SPIRType,spirv_cross::SPIRType&>
                      ((Compiler *)this,ptr_type_id,&ptr_type);
            IVar20.id = uVar12 + 1;
            mbr_name_qual._M_dataplus._M_p._0_4_ = 3;
            pSVar18 = (SPIRVariable *)&initializer;
            Compiler::set<spirv_cross::SPIRVariable,unsigned_int&,spv::StorageClass,unsigned_int&>
                      ((Compiler *)this,IVar20.id,&ptr_type_id,(StorageClass *)&mbr_name_qual,
                       (uint *)pSVar18);
            pSVar4 = local_1a8;
            SmallVector<spirv_cross::TypedID<(spirv_cross::Types)2>,_8UL>::reserve
                      (local_190,
                       (local_1a8->local_variables).
                       super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.buffer_size +
                       1);
            sVar3 = (pSVar4->local_variables).
                    super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.buffer_size;
            (pSVar4->local_variables).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>
            .ptr[sVar3].id = IVar20.id;
            (pSVar4->local_variables).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>
            .buffer_size = sVar3 + 1;
            SmallVector<unsigned_int,_8UL>::reserve
                      (local_198,
                       (this->vars_needing_early_declaration).super_VectorView<unsigned_int>.
                       buffer_size + 1);
            sVar3 = (this->vars_needing_early_declaration).super_VectorView<unsigned_int>.
                    buffer_size;
            (this->vars_needing_early_declaration).super_VectorView<unsigned_int>.ptr[sVar3] =
                 IVar20.id;
            (this->vars_needing_early_declaration).super_VectorView<unsigned_int>.buffer_size =
                 sVar3 + 1;
            (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x14])
                      (&mbr_name_qual,this,(ulong)builtin,3);
            Compiler::set_name((Compiler *)this,IVar20,&mbr_name_qual);
            var = local_1a0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)mbr_name_qual._M_dataplus._M_p != &mbr_name_qual.field_2) {
              operator_delete(mbr_name_qual._M_dataplus._M_p);
            }
            Compiler::set_decoration((Compiler *)this,IVar20,DecorationBuiltIn,builtin);
            ptr_type.super_IVariant._vptr_IVariant = (_func_int **)&PTR__SPIRType_003d5290;
            ::std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
            ::~_Hashtable(&ptr_type.member_name_cache._M_h);
            ptr_type.member_type_index_redirection.super_VectorView<unsigned_int>.buffer_size = 0;
            if ((AlignedBuffer<unsigned_int,_8UL> *)
                ptr_type.member_type_index_redirection.super_VectorView<unsigned_int>.ptr !=
                &ptr_type.member_type_index_redirection.stack_storage) {
              free(ptr_type.member_type_index_redirection.super_VectorView<unsigned_int>.ptr);
            }
            ptr_type.member_types.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
            buffer_size = 0;
            if ((AlignedBuffer<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *)
                ptr_type.member_types.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>
                .ptr != &ptr_type.member_types.stack_storage) {
              free(ptr_type.member_types.
                   super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr);
            }
            ptr_type.array_size_literal.super_VectorView<bool>.buffer_size = 0;
            if ((AlignedBuffer<bool,_8UL> *)ptr_type.array_size_literal.super_VectorView<bool>.ptr
                != &ptr_type.array_size_literal.stack_storage) {
              free(ptr_type.array_size_literal.super_VectorView<bool>.ptr);
            }
            ptr_type.array.super_VectorView<unsigned_int>.buffer_size = 0;
            if ((AlignedBuffer<unsigned_int,_8UL> *)
                ptr_type.array.super_VectorView<unsigned_int>.ptr != &ptr_type.array.stack_storage)
            {
              free(ptr_type.array.super_VectorView<unsigned_int>.ptr);
            }
          }
        }
        else if ((!bVar5) ||
                (bVar7 = Compiler::has_active_builtin((Compiler *)this,builtin,storage), bVar7)) {
          bVar7 = Compiler::is_matrix((Compiler *)this,type_00);
          if ((bVar7) || (bVar7 = Compiler::is_array((Compiler *)this,type_00), bVar7)) {
            local_240 = 0;
          }
          else {
            local_240 = (undefined4)
                        CONCAT71(extraout_var,*(int *)&(type_00->super_IVariant).field_0xc != 0xf);
          }
          bVar7 = true;
          storage_00 = storage;
          if ((char)local_24c != '\0') {
            EVar13 = Compiler::get_execution_model((Compiler *)this);
            bVar7 = EVar13 == ExecutionModelFragment;
            storage_00 = StorageClassInput;
          }
          bVar10 = variable_storage_requires_stage_io(this,storage_00);
          BVar11 = builtin;
          ts_1 = (uint *)0x1;
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                    (&ptr_type,this,(ulong)(var->super_IVariant).self.id);
          mbr_name_qual._M_dataplus._M_p = (pointer)&mbr_name_qual.field_2;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&mbr_name_qual,ptr_type.super_IVariant._vptr_IVariant,
                     ptr_type.super_IVariant._8_8_ + (long)ptr_type.super_IVariant._vptr_IVariant);
          _ptr_type_id = local_1b8;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&ptr_type_id,ptr_type.super_IVariant._vptr_IVariant,
                     ptr_type.super_IVariant._8_8_ + (long)ptr_type.super_IVariant._vptr_IVariant);
          if (local_224 != 1) {
            join<char_const(&)[2],unsigned_int&>
                      ((string *)&initializer,(spirv_cross *)0x349680,(char (*) [2])&local_248,ts_1)
            ;
            ::std::__cxx11::string::_M_append
                      ((char *)&mbr_name_qual,CONCAT44(uStack_214,initializer));
            if ((undefined1 *)CONCAT44(uStack_214,initializer) != local_208) {
              operator_delete((undefined1 *)CONCAT44(uStack_214,initializer));
            }
            join<char_const(&)[2],unsigned_int&,char_const(&)[2]>
                      ((string *)&initializer,(spirv_cross *)0x3434bc,(char (*) [2])&local_248,
                       (uint *)0x33ba6c,(char (*) [2])pSVar18);
            ::std::__cxx11::string::_M_append((char *)&ptr_type_id,CONCAT44(uStack_214,initializer))
            ;
            if ((undefined1 *)CONCAT44(uStack_214,initializer) != local_208) {
              operator_delete((undefined1 *)CONCAT44(uStack_214,initializer));
            }
          }
          meta = local_220;
          pSVar18 = var;
          if (((~bVar10 | (byte)local_240) & 1) == 0 &&
              (bVar5 & bVar7 & BVar11 - BuiltInVertexId < 0xfffffffe) == 0) {
            add_composite_member_variable_to_interface_block
                      (this,storage,local_238,local_230,var,type,uVar12,local_220,&mbr_name_qual,
                       (string *)&ptr_type_id,&location,&var_mbr_idx);
          }
          else {
            add_plain_member_variable_to_interface_block
                      (this,storage,local_238,local_230,var,type,uVar12,local_220,&mbr_name_qual,
                       (string *)&ptr_type_id,&location,&var_mbr_idx);
          }
          if (_ptr_type_id != local_1b8) {
            operator_delete(_ptr_type_id);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)mbr_name_qual._M_dataplus._M_p != &mbr_name_qual.field_2) {
            operator_delete(mbr_name_qual._M_dataplus._M_p);
          }
          uVar19 = var_mbr_idx;
          if (ptr_type.super_IVariant._vptr_IVariant != (_func_int **)&ptr_type.width) {
            operator_delete(ptr_type.super_IVariant._vptr_IVariant);
            uVar19 = var_mbr_idx;
          }
        }
        uVar19 = uVar19 + 1;
        uVar17 = uVar17 + 1;
        uVar14 = (ulong)(uint)(type->member_types).
                              super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
                              buffer_size;
        uVar12 = local_224;
        var_mbr_idx = uVar19;
      } while (uVar17 < uVar14);
    }
    local_248 = local_248 + 1;
  } while (local_248 < uVar12);
  if (((bVar8 & bVar9) != 0) &&
     ((bVar5 = Compiler::is_builtin_variable((Compiler *)this,var), !bVar5 ||
      (EVar13 = Compiler::get_execution_model((Compiler *)this),
      EVar13 == ExecutionModelTessellationControl)))) {
    bVar5 = Compiler::is_builtin_variable((Compiler *)this,var);
    if (bVar5) {
      if ((int)(type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
               buffer_size != 0) {
        uVar12 = 0;
        do {
          id.id = (type->super_IVariant).self.id;
          uVar19 = Compiler::get_member_decoration((Compiler *)this,id,uVar12,DecorationBuiltIn);
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x14])
                    (&ptr_type,this,(ulong)uVar19,3);
          Compiler::set_member_name((Compiler *)this,id,uVar12,(string *)&ptr_type);
          if (ptr_type.super_IVariant._vptr_IVariant != (_func_int **)&ptr_type.width) {
            operator_delete(ptr_type.super_IVariant._vptr_IVariant);
          }
          uVar12 = uVar12 + 1;
        } while (uVar12 < (uint)(type->member_types).
                                super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
                                buffer_size);
      }
      IVar20.id = (type->super_IVariant).self.id;
      ptr_type.super_IVariant._vptr_IVariant = (_func_int **)&ptr_type.width;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&ptr_type,"gl_PerVertex","");
      Compiler::set_name((Compiler *)this,IVar20,(string *)&ptr_type);
      if (ptr_type.super_IVariant._vptr_IVariant != (_func_int **)&ptr_type.width) {
        operator_delete(ptr_type.super_IVariant._vptr_IVariant);
      }
      IVar20.id = (var->super_IVariant).self.id;
      ptr_type.super_IVariant._vptr_IVariant = (_func_int **)&ptr_type.width;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&ptr_type,"gl_out_masked","");
      Compiler::set_name((Compiler *)this,IVar20,(string *)&ptr_type);
      if (ptr_type.super_IVariant._vptr_IVariant != (_func_int **)&ptr_type.width) {
        operator_delete(ptr_type.super_IVariant._vptr_IVariant);
      }
      (this->stage_out_masked_builtin_type_id).id = (type->super_IVariant).self.id;
    }
    emit_local_masked_variable(this,var,meta->strip_array);
  }
  return;
}

Assistant:

void CompilerMSL::add_variable_to_interface_block(StorageClass storage, const string &ib_var_ref, SPIRType &ib_type,
                                                  SPIRVariable &var, InterfaceBlockMeta &meta)
{
	auto &entry_func = get<SPIRFunction>(ir.default_entry_point);
	// Tessellation control I/O variables and tessellation evaluation per-point inputs are
	// usually declared as arrays. In these cases, we want to add the element type to the
	// interface block, since in Metal it's the interface block itself which is arrayed.
	auto &var_type = meta.strip_array ? get_variable_element_type(var) : get_variable_data_type(var);
	bool is_builtin = is_builtin_variable(var);
	auto builtin = BuiltIn(get_decoration(var.self, DecorationBuiltIn));
	bool is_block = has_decoration(var_type.self, DecorationBlock);

	// If stage variables are masked out, emit them as plain variables instead.
	// For builtins, we query them one by one later.
	// IO blocks are not masked here, we need to mask them per-member instead.
	if (storage == StorageClassOutput && is_stage_output_variable_masked(var))
	{
		// If we ignore an output, we must still emit it, since it might be used by app.
		// Instead, just emit it as early declaration.
		emit_local_masked_variable(var, meta.strip_array);
		return;
	}

	if (storage == StorageClassInput && has_decoration(var.self, DecorationPerVertexKHR))
		SPIRV_CROSS_THROW("PerVertexKHR decoration is not supported in MSL.");

	// If variable names alias, they will end up with wrong names in the interface struct, because
	// there might be aliases in the member name cache and there would be a mismatch in fixup_in code.
	// Make sure to register the variables as unique resource names ahead of time.
	// This would normally conflict with the name cache when emitting local variables,
	// but this happens in the setup stage, before we hit compilation loops.
	// The name cache is cleared before we actually emit code, so this is safe.
	add_resource_name(var.self);

	if (var_type.basetype == SPIRType::Struct)
	{
		bool block_requires_flattening =
		    variable_storage_requires_stage_io(storage) || (is_block && var_type.array.empty());
		bool needs_local_declaration = !is_builtin && block_requires_flattening && meta.allow_local_declaration;

		if (needs_local_declaration)
		{
			// For I/O blocks or structs, we will need to pass the block itself around
			// to functions if they are used globally in leaf functions.
			// Rather than passing down member by member,
			// we unflatten I/O blocks while running the shader,
			// and pass the actual struct type down to leaf functions.
			// We then unflatten inputs, and flatten outputs in the "fixup" stages.
			emit_local_masked_variable(var, meta.strip_array);
		}

		if (!block_requires_flattening)
		{
			// In Metal tessellation shaders, the interface block itself is arrayed. This makes things
			// very complicated, since stage-in structures in MSL don't support nested structures.
			// Luckily, for stage-out when capturing output, we can avoid this and just add
			// composite members directly, because the stage-out structure is stored to a buffer,
			// not returned.
			add_plain_variable_to_interface_block(storage, ib_var_ref, ib_type, var, meta);
		}
		else
		{
			bool masked_block = false;
			uint32_t location = UINT32_MAX;
			uint32_t var_mbr_idx = 0;
			uint32_t elem_cnt = 1;
			if (is_matrix(var_type))
			{
				if (is_array(var_type))
					SPIRV_CROSS_THROW("MSL cannot emit arrays-of-matrices in input and output variables.");

				elem_cnt = var_type.columns;
			}
			else if (is_array(var_type))
			{
				if (var_type.array.size() != 1)
					SPIRV_CROSS_THROW("MSL cannot emit arrays-of-arrays in input and output variables.");

				elem_cnt = to_array_size_literal(var_type);
			}

			for (uint32_t elem_idx = 0; elem_idx < elem_cnt; elem_idx++)
			{
				// Flatten the struct members into the interface struct
				for (uint32_t mbr_idx = 0; mbr_idx < uint32_t(var_type.member_types.size()); mbr_idx++)
				{
					builtin = BuiltInMax;
					is_builtin = is_member_builtin(var_type, mbr_idx, &builtin);
					auto &mbr_type = get<SPIRType>(var_type.member_types[mbr_idx]);

					if (storage == StorageClassOutput && is_stage_output_block_member_masked(var, mbr_idx, meta.strip_array))
					{
						location = UINT32_MAX; // Skip this member and resolve location again on next var member

						if (is_block)
							masked_block = true;

						// Non-builtin block output variables are just ignored, since they will still access
						// the block variable as-is. They're just not flattened.
						if (is_builtin && !meta.strip_array)
						{
							// Emit a fake variable instead.
							uint32_t ids = ir.increase_bound_by(2);
							uint32_t ptr_type_id = ids + 0;
							uint32_t var_id = ids + 1;

							auto ptr_type = mbr_type;
							ptr_type.pointer = true;
							ptr_type.pointer_depth++;
							ptr_type.parent_type = var_type.member_types[mbr_idx];
							ptr_type.storage = StorageClassOutput;

							uint32_t initializer = 0;
							if (var.initializer)
								if (auto *c = maybe_get<SPIRConstant>(var.initializer))
									initializer = c->subconstants[mbr_idx];

							set<SPIRType>(ptr_type_id, ptr_type);
							set<SPIRVariable>(var_id, ptr_type_id, StorageClassOutput, initializer);
							entry_func.add_local_variable(var_id);
							vars_needing_early_declaration.push_back(var_id);
							set_name(var_id, builtin_to_glsl(builtin, StorageClassOutput));
							set_decoration(var_id, DecorationBuiltIn, builtin);
						}
					}
					else if (!is_builtin || has_active_builtin(builtin, storage))
					{
						bool is_composite_type = is_matrix(mbr_type) || is_array(mbr_type) || mbr_type.basetype == SPIRType::Struct;
						bool attribute_load_store =
								storage == StorageClassInput && get_execution_model() != ExecutionModelFragment;
						bool storage_is_stage_io = variable_storage_requires_stage_io(storage);

						// Clip/CullDistance always need to be declared as user attributes.
						if (builtin == BuiltInClipDistance || builtin == BuiltInCullDistance)
							is_builtin = false;

						const string var_name = to_name(var.self);
						string mbr_name_qual = var_name;
						string var_chain_qual = var_name;
						if (elem_cnt > 1)
						{
							mbr_name_qual += join("_", elem_idx);
							var_chain_qual += join("[", elem_idx, "]");
						}

						if ((!is_builtin || attribute_load_store) && storage_is_stage_io && is_composite_type)
						{
							add_composite_member_variable_to_interface_block(storage, ib_var_ref, ib_type,
							                                                 var, var_type, mbr_idx, meta,
							                                                 mbr_name_qual, var_chain_qual,
							                                                 location, var_mbr_idx);
						}
						else
						{
							add_plain_member_variable_to_interface_block(storage, ib_var_ref, ib_type,
							                                             var, var_type, mbr_idx, meta,
							                                             mbr_name_qual, var_chain_qual,
							                                             location, var_mbr_idx);
						}
					}
					var_mbr_idx++;
				}
			}

			// If we're redirecting a block, we might still need to access the original block
			// variable if we're masking some members.
			if (masked_block && !needs_local_declaration && (!is_builtin_variable(var) || is_tesc_shader()))
			{
				if (is_builtin_variable(var))
				{
					// Ensure correct names for the block members if we're actually going to
					// declare gl_PerVertex.
					for (uint32_t mbr_idx = 0; mbr_idx < uint32_t(var_type.member_types.size()); mbr_idx++)
					{
						set_member_name(var_type.self, mbr_idx, builtin_to_glsl(
								BuiltIn(get_member_decoration(var_type.self, mbr_idx, DecorationBuiltIn)),
								StorageClassOutput));
					}

					set_name(var_type.self, "gl_PerVertex");
					set_name(var.self, "gl_out_masked");
					stage_out_masked_builtin_type_id = var_type.self;
				}
				emit_local_masked_variable(var, meta.strip_array);
			}
		}
	}
	else if (is_tese_shader() && storage == StorageClassInput && !meta.strip_array && is_builtin &&
	         (builtin == BuiltInTessLevelOuter || builtin == BuiltInTessLevelInner))
	{
		add_tess_level_input_to_interface_block(ib_var_ref, ib_type, var);
	}
	else if (var_type.basetype == SPIRType::Boolean || var_type.basetype == SPIRType::Char ||
	         type_is_integral(var_type) || type_is_floating_point(var_type))
	{
		if (!is_builtin || has_active_builtin(builtin, storage))
		{
			bool is_composite_type = is_matrix(var_type) || is_array(var_type);
			bool storage_is_stage_io = variable_storage_requires_stage_io(storage);
			bool attribute_load_store = storage == StorageClassInput && get_execution_model() != ExecutionModelFragment;

			// Clip/CullDistance always needs to be declared as user attributes.
			if (builtin == BuiltInClipDistance || builtin == BuiltInCullDistance)
				is_builtin = false;

			// MSL does not allow matrices or arrays in input or output variables, so need to handle it specially.
			if ((!is_builtin || attribute_load_store) && storage_is_stage_io && is_composite_type)
			{
				add_composite_variable_to_interface_block(storage, ib_var_ref, ib_type, var, meta);
			}
			else
			{
				add_plain_variable_to_interface_block(storage, ib_var_ref, ib_type, var, meta);
			}
		}
	}
}